

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_impl.c
# Opt level: O1

int normal_scanComment(ENCODING *enc,char *ptr,char *end,char **nextTokPtr)

{
  byte *pbVar1;
  char cVar2;
  int iVar3;
  char **ppcVar4;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  char *pcVar5;
  byte *pbVar6;
  
  iVar3 = -1;
  if (ptr != end) {
    ppcVar4 = (char **)0x0;
    iVar3 = 0;
    if (*ptr == '-') {
      ptr = ptr + 1;
      pcVar5 = end;
      iVar3 = -1;
      if (ptr != end) {
LAB_0015857a:
        cVar2 = *(char *)((long)enc[1].scanners + (ulong)(byte)*ptr);
        switch(cVar2) {
        case '\0':
        case '\x01':
        case '\b':
          break;
        case '\x02':
        case '\x03':
        case '\x04':
          goto switchD_00158595_caseD_2;
        case '\x05':
          if ((long)end - (long)ptr < 2) {
            return -2;
          }
          iVar3 = (*enc[3].scanners[2])(enc,ptr,pcVar5,ppcVar4);
          if (iVar3 != 0) break;
          pbVar6 = (byte *)ptr + 2;
          pcVar5 = extraout_RDX;
          goto LAB_00158622;
        case '\x06':
          if ((long)end - (long)ptr < 3) {
            return -2;
          }
          iVar3 = (*enc[3].scanners[3])(enc,ptr,pcVar5,ppcVar4);
          if (iVar3 == 0) {
            pbVar6 = (byte *)ptr + 3;
            pcVar5 = extraout_RDX_01;
            goto LAB_00158622;
          }
          break;
        case '\a':
          if ((long)end - (long)ptr < 4) {
            return -2;
          }
          iVar3 = (*enc[3].literalScanners[0])(enc,ptr,pcVar5,ppcVar4);
          if (iVar3 == 0) {
            pbVar6 = (byte *)ptr + 4;
            pcVar5 = extraout_RDX_00;
            goto LAB_00158622;
          }
          break;
        default:
          if (cVar2 == '\x1b') {
            pbVar6 = (byte *)ptr + 1;
            if (pbVar6 == (byte *)end) {
              return -1;
            }
            if (*pbVar6 != 0x2d) goto LAB_00158622;
            if ((byte *)ptr + 2 == (byte *)end) {
              return -1;
            }
            pbVar6 = (byte *)ptr + 3;
            pbVar1 = (byte *)ptr + 2;
            ptr = (char *)((byte *)ptr + 2);
            if (*pbVar1 == 0x3e) {
              ptr = (char *)pbVar6;
            }
            iVar3 = 0xd;
            if (*pbVar1 != 0x3e) {
              iVar3 = 0;
            }
            goto LAB_00158632;
          }
switchD_00158595_caseD_2:
          pbVar6 = (byte *)ptr + 1;
LAB_00158622:
          ptr = (char *)pbVar6;
          if (pbVar6 == (byte *)end) {
            return -1;
          }
          goto LAB_0015857a;
        }
        iVar3 = 0;
        goto LAB_00158632;
      }
    }
    else {
LAB_00158632:
      *nextTokPtr = ptr;
    }
  }
  return iVar3;
}

Assistant:

static
int PREFIX(scanComment)(const ENCODING *enc, const char *ptr, const char *end,
                        const char **nextTokPtr)
{
  if (ptr != end) {
    if (!CHAR_MATCHES(enc, ptr, ASCII_MINUS)) {
      *nextTokPtr = ptr;
      return XML_TOK_INVALID;
    }
    ptr += MINBPC(enc);
    while (ptr != end) {
      switch (BYTE_TYPE(enc, ptr)) {
      INVALID_CASES(ptr, nextTokPtr)
      case BT_MINUS:
        if ((ptr += MINBPC(enc)) == end)
          return XML_TOK_PARTIAL;
        if (CHAR_MATCHES(enc, ptr, ASCII_MINUS)) {
          if ((ptr += MINBPC(enc)) == end)
            return XML_TOK_PARTIAL;
          if (!CHAR_MATCHES(enc, ptr, ASCII_GT)) {
            *nextTokPtr = ptr;
            return XML_TOK_INVALID;
          }
          *nextTokPtr = ptr + MINBPC(enc);
          return XML_TOK_COMMENT;
        }
        break;
      default:
        ptr += MINBPC(enc);
        break;
      }
    }
  }
  return XML_TOK_PARTIAL;
}